

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

bool __thiscall cmCTestP4::DiffParser::ProcessLine(DiffParser *this)

{
  string *s;
  bool bVar1;
  string sStack_38;
  
  if (((this->super_LineParser).Line._M_string_length != 0) &&
     (s = &(this->super_LineParser).Line, *(s->_M_dataplus)._M_p == '=')) {
    bVar1 = cmsys::RegularExpression::find(&this->RegexDiff,s);
    if (bVar1) {
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&sStack_38,&(this->RegexDiff).regmatch,1);
      std::__cxx11::string::operator=((string *)&this->CurrentPath,(string *)&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
      this->AlreadyNotified = false;
      return true;
    }
  }
  if (this->AlreadyNotified == false) {
    (*(this->P4->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[10])
              (this->P4,1,&this->CurrentPath);
    this->AlreadyNotified = true;
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (!this->Line.empty() && this->Line[0] == '=' &&
        this->RegexDiff.find(this->Line)) {
      this->CurrentPath = this->RegexDiff.match(1);
      this->AlreadyNotified = false;
    } else {
      if (!this->AlreadyNotified) {
        this->P4->DoModification(PathModified, this->CurrentPath);
        this->AlreadyNotified = true;
      }
    }
    return true;
  }